

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O3

int __thiscall
alex::
AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::
insert_using_shifts(AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                    *this,double *key,double payload,int pos)

{
  uint pos_00;
  ulong uVar1;
  double *pdVar2;
  double *pdVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  
  uVar4 = closest_gap(this,pos);
  if ((-1 < (int)uVar4) && ((int)uVar4 < this->data_capacity_)) {
    this->bitmap_[uVar4 >> 6] = this->bitmap_[uVar4 >> 6] | 1L << ((ulong)uVar4 & 0x3f);
    iVar7 = uVar4 - pos;
    if ((int)uVar4 < pos) {
      pos_00 = pos - 1;
      if (uVar4 < pos_00) {
        pdVar2 = this->payload_slots_;
        lVar5 = 0;
        pdVar3 = this->key_slots_;
        do {
          pdVar3[(ulong)uVar4 + lVar5] = pdVar3[(ulong)uVar4 + lVar5 + 1];
          pdVar2[(ulong)uVar4 + lVar5] = pdVar2[(ulong)uVar4 + lVar5 + 1];
          lVar5 = lVar5 + 1;
        } while ((int)(uVar4 + (int)lVar5) < (int)pos_00);
      }
      insert_element_at(this,key,payload,pos_00);
      iVar7 = ~uVar4 + pos;
      pos = pos_00;
    }
    else {
      if (iVar7 != 0 && pos <= (int)uVar4) {
        pdVar2 = this->key_slots_;
        pdVar3 = this->payload_slots_;
        uVar6 = (ulong)uVar4;
        do {
          uVar1 = uVar6 - 1;
          pdVar2[uVar6] = pdVar2[uVar6 - 1];
          pdVar3[uVar6] = pdVar3[uVar6 - 1];
          uVar6 = uVar1;
        } while ((long)pos < (long)uVar1);
      }
      insert_element_at(this,key,payload,pos);
    }
    this->num_shifts_ = this->num_shifts_ + (long)iVar7;
    return pos;
  }
  __assert_fail("pos >= 0 && pos < data_capacity_",
                "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex_nodes.h"
                ,0x1e4,
                "void alex::AlexDataNode<double, double>::set_bit(int) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
               );
}

Assistant:

int insert_using_shifts(const T& key, P payload, int pos) {
    // Find the closest gap
    int gap_pos = closest_gap(pos);
    set_bit(gap_pos);
    if (gap_pos >= pos) {
      for (int i = gap_pos; i > pos; i--) {
#if ALEX_DATA_NODE_SEP_ARRAYS
        key_slots_[i] = key_slots_[i - 1];
        payload_slots_[i] = payload_slots_[i - 1];
#else
        data_slots_[i] = data_slots_[i - 1];
#endif
      }
      insert_element_at(key, payload, pos);
      num_shifts_ += gap_pos - pos;
      return pos;
    } else {
      for (int i = gap_pos; i < pos - 1; i++) {
#if ALEX_DATA_NODE_SEP_ARRAYS
        key_slots_[i] = key_slots_[i + 1];
        payload_slots_[i] = payload_slots_[i + 1];
#else
        data_slots_[i] = data_slots_[i + 1];
#endif
      }
      insert_element_at(key, payload, pos - 1);
      num_shifts_ += pos - gap_pos - 1;
      return pos - 1;
    }
  }